

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

bool __thiscall ghc::filesystem::path::has_parent_path(path *this)

{
  string local_30 [8];
  long local_28;
  
  parent_path((path *)local_30,this);
  std::__cxx11::string::~string(local_30);
  return local_28 != 0;
}

Assistant:

GHC_INLINE bool path::has_parent_path() const
{
    return !parent_path().empty();
}